

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topic_manager.cpp
# Opt level: O2

int __thiscall miniros::TopicManager::shutdown(TopicManager *this,int __fd,int __how)

{
  recursive_mutex *__mutex;
  list<std::shared_ptr<miniros::Subscription>,_std::allocator<std::shared_ptr<miniros::Subscription>_>_>
  *this_00;
  RPCManagerPtr *pRVar1;
  __shared_ptr<miniros::Publication,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  int iVar3;
  string *topic;
  int __how_00;
  __shared_ptr<miniros::Publication,_(__gnu_cxx::_Lock_policy)2> *p_Var4;
  pthread_mutex_t *__mutex_00;
  _List_node_base *p_Var5;
  PublicationPtr pub;
  allocator<char> local_69;
  string local_68;
  pthread_mutex_t *local_48;
  pthread_mutex_t *local_40;
  __shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2> *local_38;
  
  __mutex_00 = (pthread_mutex_t *)&this->shutting_down_mutex_;
  std::mutex::lock((mutex *)&__mutex_00->__data);
  if (this->shutting_down_ == false) {
    __mutex = &this->advertised_topics_mutex_;
    local_40 = __mutex_00;
    std::lock<std::mutex,std::recursive_mutex>(&this->subs_mutex_,__mutex);
    this->shutting_down_ = true;
    pthread_mutex_unlock((pthread_mutex_t *)this);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    observer::Connection::disconnect
              ((Connection *)
               (this->poll_watcher_)._M_t.
               super___uniq_ptr_impl<miniros::TopicManager::PollWatcher,_std::default_delete<miniros::TopicManager::PollWatcher>_>
               ._M_t.
               super__Tuple_impl<0UL,_miniros::TopicManager::PollWatcher_*,_std::default_delete<miniros::TopicManager::PollWatcher>_>
               .super__Head_base<0UL,_miniros::TopicManager::PollWatcher_*,_false>._M_head_impl);
    RPCManager::unbind((this->rpc_manager_).
                       super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       "publisherUpdate");
    pRVar1 = &this->rpc_manager_;
    RPCManager::unbind((pRVar1->super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>)
                       ._M_ptr,"requestTopic");
    RPCManager::unbind((pRVar1->super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>)
                       ._M_ptr,"getBusStats");
    RPCManager::unbind((pRVar1->super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>)
                       ._M_ptr,"getBusInfo");
    RPCManager::unbind((pRVar1->super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>)
                       ._M_ptr,"getSubscriptions");
    RPCManager::unbind((pRVar1->super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>)
                       ._M_ptr,"getPublications");
    if (console::g_initialized == '\0') {
      console::initialize();
    }
    if (shutdown::loc.initialized_ == false) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_68,"miniros.topic_manager",&local_69);
      console::initializeLogLocation(&shutdown::loc,&local_68,Debug);
      std::__cxx11::string::~string((string *)&local_68);
    }
    if (shutdown::loc.level_ != Debug) {
      console::setLogLocationLevel(&shutdown::loc,Debug);
      console::checkLogLocationEnabled(&shutdown::loc);
    }
    if (shutdown::loc.logger_enabled_ == true) {
      console::print((FilterBase *)0x0,shutdown::loc.logger_,shutdown::loc.level_,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/topic_manager.cpp"
                     ,0x96,"void miniros::TopicManager::shutdown()","Shutting down topics...");
    }
    if (console::g_initialized == '\0') {
      console::initialize();
    }
    if (shutdown()::loc.initialized_ == false) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_68,"miniros.topic_manager",&local_69);
      console::initializeLogLocation(&shutdown()::loc,&local_68,Debug);
      std::__cxx11::string::~string((string *)&local_68);
    }
    if (shutdown()::loc.level_ != Debug) {
      console::setLogLocationLevel(&shutdown()::loc,Debug);
      console::checkLogLocationEnabled(&shutdown()::loc);
    }
    if (shutdown()::loc.logger_enabled_ == true) {
      console::print((FilterBase *)0x0,shutdown()::loc.logger_,shutdown()::loc.level_,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/topic_manager.cpp"
                     ,0x97,"void miniros::TopicManager::shutdown()","  shutting down publishers");
    }
    local_48 = (pthread_mutex_t *)__mutex;
    local_38 = &pRVar1->super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>;
    std::recursive_mutex::lock(__mutex);
    p_Var2 = &((this->advertised_topics_).
               super__Vector_base<std::shared_ptr<miniros::Publication>,_std::allocator<std::shared_ptr<miniros::Publication>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->
              super___shared_ptr<miniros::Publication,_(__gnu_cxx::_Lock_policy)2>;
    for (p_Var4 = &((this->advertised_topics_).
                    super__Vector_base<std::shared_ptr<miniros::Publication>,_std::allocator<std::shared_ptr<miniros::Publication>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
                   super___shared_ptr<miniros::Publication,_(__gnu_cxx::_Lock_policy)2>;
        p_Var4 != p_Var2; p_Var4 = p_Var4 + 1) {
      std::__shared_ptr<miniros::Publication,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<miniros::Publication,_(__gnu_cxx::_Lock_policy)2> *)&local_68,p_Var4)
      ;
      if ((bool)local_68._M_dataplus._M_p[0x138] == false) {
        unregisterPublisher(this,(string *)local_68._M_dataplus._M_p);
      }
      Publication::drop((Publication *)local_68._M_dataplus._M_p);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_68._M_string_length);
    }
    std::
    vector<std::shared_ptr<miniros::Publication>,_std::allocator<std::shared_ptr<miniros::Publication>_>_>
    ::clear(&this->advertised_topics_);
    pthread_mutex_unlock(local_48);
    __mutex_00 = local_40;
    if (console::g_initialized == '\0') {
      console::initialize();
    }
    if (shutdown()::loc.initialized_ == false) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_68,"miniros.topic_manager",&local_69);
      console::initializeLogLocation(&shutdown()::loc,&local_68,Debug);
      std::__cxx11::string::~string((string *)&local_68);
    }
    if (shutdown()::loc.level_ != Debug) {
      console::setLogLocationLevel(&shutdown()::loc,Debug);
      console::checkLogLocationEnabled(&shutdown()::loc);
    }
    if (shutdown()::loc.logger_enabled_ == true) {
      console::print((FilterBase *)0x0,shutdown()::loc.logger_,shutdown()::loc.level_,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/topic_manager.cpp"
                     ,0xa4,"void miniros::TopicManager::shutdown()","  shutting down subscribers");
    }
    std::mutex::lock(&this->subs_mutex_);
    this_00 = &this->subscriptions_;
    p_Var5 = (_List_node_base *)this_00;
    while (p_Var5 = (((_List_base<std::shared_ptr<miniros::Subscription>,_std::allocator<std::shared_ptr<miniros::Subscription>_>_>
                       *)&p_Var5->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var5 != (_List_node_base *)this_00) {
      std::__shared_ptr<miniros::Subscription,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<miniros::Subscription,_(__gnu_cxx::_Lock_policy)2> *)&local_68,
                 (__shared_ptr<miniros::Subscription,_(__gnu_cxx::_Lock_policy)2> *)(p_Var5 + 1));
      topic = Subscription::getName_abi_cxx11_((Subscription *)local_68._M_dataplus._M_p);
      unregisterSubscriber(this,topic);
      Subscription::shutdown((Subscription *)local_68._M_dataplus._M_p,(int)topic,__how_00);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_68._M_string_length);
    }
    std::__cxx11::
    list<std::shared_ptr<miniros::Subscription>,_std::allocator<std::shared_ptr<miniros::Subscription>_>_>
    ::clear(this_00);
    pthread_mutex_unlock((pthread_mutex_t *)this);
    std::__shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>::reset(local_38);
    std::__shared_ptr<miniros::ConnectionManager,_(__gnu_cxx::_Lock_policy)2>::reset
              (&(this->connection_manager_).
                super___shared_ptr<miniros::ConnectionManager,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_ptr<miniros::PollManager,_(__gnu_cxx::_Lock_policy)2>::reset
              (&(this->poll_manager_).
                super___shared_ptr<miniros::PollManager,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_ptr<miniros::MasterLink,_(__gnu_cxx::_Lock_policy)2>::reset
              (&(this->master_link_).
                super___shared_ptr<miniros::MasterLink,_(__gnu_cxx::_Lock_policy)2>);
  }
  iVar3 = pthread_mutex_unlock(__mutex_00);
  return iVar3;
}

Assistant:

void TopicManager::shutdown()
{
  std::scoped_lock<std::mutex> shutdown_lock(shutting_down_mutex_);
  if (shutting_down_) {
    return;
  }

  {
    std::lock(subs_mutex_, advertised_topics_mutex_);
    shutting_down_ = true;
    subs_mutex_.unlock();
    advertised_topics_mutex_.unlock();
  }

  poll_watcher_->disconnect();

  rpc_manager_->unbind("publisherUpdate");
  rpc_manager_->unbind("requestTopic");
  rpc_manager_->unbind("getBusStats");
  rpc_manager_->unbind("getBusInfo");
  rpc_manager_->unbind("getSubscriptions");
  rpc_manager_->unbind("getPublications");

  MINIROS_DEBUG("Shutting down topics...");
  MINIROS_DEBUG("  shutting down publishers");
  {
    std::scoped_lock<std::recursive_mutex> adv_lock(advertised_topics_mutex_);

    for (PublicationPtr pub : advertised_topics_) {
      if (!pub->isDropped())
        unregisterPublisher(pub->getName());
      pub->drop();
    }
    advertised_topics_.clear();
  }

  // unregister all of our subscriptions
  MINIROS_DEBUG("  shutting down subscribers");
  {
    std::scoped_lock<std::mutex> subs_lock(subs_mutex_);

    for (SubscriptionPtr s : subscriptions_) {
      // Remove us as a subscriber from the master
      unregisterSubscriber(s->getName());
      // now, drop our side of the connection
      s->shutdown();
    }
    subscriptions_.clear();
  }

  rpc_manager_.reset();
  connection_manager_.reset();
  poll_manager_.reset();
  master_link_.reset();
}